

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::capturedExpressionWithSecondArgument
                   (string *__return_storage_ptr__,string *capturedExpression,string *secondArg)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  size_type *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  if ((secondArg->_M_string_length == 0) ||
     (iVar3 = std::__cxx11::string::compare((char *)secondArg), iVar3 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (capturedExpression->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + capturedExpression->_M_string_length
              );
    return __return_storage_ptr__;
  }
  pcVar1 = (capturedExpression->_M_dataplus)._M_p;
  local_48 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + capturedExpression->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_48,(ulong)(secondArg->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_48 == &__str._M_string_length) {
    return __return_storage_ptr__;
  }
  operator_delete(local_48,__str._M_string_length + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string capturedExpressionWithSecondArgument( std::string const& capturedExpression, std::string const& secondArg ) {
        return secondArg.empty() || secondArg == "\"\""
            ? capturedExpression
            : capturedExpression + ", " + secondArg;
    }